

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer_test.cc
# Opt level: O3

void __thiscall
writer_test_should_write_char_field_Test::TestBody(writer_test_should_write_char_field_Test *this)

{
  bool bVar1;
  size_t __n;
  char *message;
  ostringstream local_1d0 [8];
  ostringstream oss;
  ios_base local_160 [264];
  internal local_58 [8];
  AssertionResult gtest_ar;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  undefined2 local_22;
  AssertHelper local_20;
  
  local_22 = 0x34;
  std::__cxx11::ostringstream::ostringstream(local_1d0);
  Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<39U,_Fixpp::Type::Char>_>_>::write
            ((int)local_1d0,&local_22,__n);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            (local_58,"oss.str()","\"39=4|\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [6])"39=4|");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)gtest_ar.message_.ptr_ != &local_38) {
    operator_delete(gtest_ar.message_.ptr_,local_38._M_allocated_capacity + 1);
  }
  if (local_58[0] == (internal)0x0) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    if (gtest_ar._0_8_ == 0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Abc-Arbitrage[P]fixpp/tests/writer_test.cc"
               ,0x5c,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (gtest_ar.message_.ptr_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(((gtest_ar.message_.ptr_)->_M_dataplus)._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::ostringstream::~ostringstream(local_1d0);
  std::ios_base::~ios_base(local_160);
  return;
}

Assistant:

TEST(writer_test, should_write_char_field)
{
    using Field = Fixpp::Field<Fixpp::Tag::OrdStatus>;
    Field field;
    field.set('4');

    std::ostringstream oss;
    writeField(oss, field);

    ASSERT_EQ(oss.str(), "39=4|");
}